

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

Region * __thiscall
FlowGraph::PropagateRegionFromPred
          (FlowGraph *this,BasicBlock *block,BasicBlock *predBlock,Region *predRegion,
          Instr **tryInstr)

{
  OpCode OVar1;
  BasicBlock *pBVar2;
  Instr *this_00;
  code *pcVar3;
  IRKind IVar4;
  bool bVar5;
  Region *pRVar6;
  Region *pRVar7;
  undefined4 *puVar8;
  Region *pRVar9;
  Instr *pIVar10;
  Func **ppFVar11;
  long lVar12;
  Func *func;
  uint lineNumber;
  Instr *pIVar13;
  
  pBVar2 = predBlock->next;
  ppFVar11 = (Func **)&pBVar2->firstInstr;
  if (pBVar2 == (BasicBlock *)0x0) {
    ppFVar11 = &predBlock->func;
  }
  lVar12 = 0x18;
  if (pBVar2 == (BasicBlock *)0x0) {
    lVar12 = 0xd0;
  }
  pIVar10 = *(Instr **)((long)&(*ppFVar11)->m_alloc + lVar12);
  if (pIVar10 == (Instr *)0x0) {
    return predRegion;
  }
  this_00 = block->firstInstr;
  OVar1 = pIVar10->m_opcode;
  switch(OVar1) {
  case TryCatch:
    pIVar13 = pIVar10->m_next;
    IVar4 = pIVar13->m_kind;
    if ((IVar4 != InstrKindLabel) && (IVar4 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x7e4,"(predLastInstr->m_next->IsLabelInstr())",
                         "predLastInstr->m_next->IsLabelInstr()");
      if (!bVar5) goto LAB_004186a4;
      *puVar8 = 0;
      pIVar13 = pIVar10->m_next;
      IVar4 = pIVar13->m_kind;
    }
    if ((IVar4 != InstrKindLabel) && (IVar4 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar5) goto LAB_004186a4;
      *puVar8 = 0;
    }
    pRVar9 = (Region *)pIVar13[1].m_src2;
    if (pIVar10->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar5) goto LAB_004186a4;
      *puVar8 = 0;
    }
    func = this->func;
    if (this_00 != pIVar10[1].m_next) goto LAB_00418489;
    pRVar6 = Region::New(RegionTypeCatch,predRegion,func);
    pRVar7 = pRVar9;
    if (pRVar9 != (Region *)0x0) {
LAB_0041817e:
      pRVar6->matchingTryRegion = pRVar7;
      pRVar9->matchingCatchRegion = pRVar6;
      return pRVar6;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x7eb,"(tryRegion)","tryRegion");
    if (bVar5) {
      *puVar8 = 0;
      pRVar7 = (Region *)0x0;
      goto LAB_0041817e;
    }
    goto LAB_004186a4;
  case TryFinally:
    pIVar13 = pIVar10->m_next;
    IVar4 = pIVar13->m_kind;
    if ((IVar4 != InstrKindLabel) && (IVar4 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x7f9,"(predLastInstr->m_next->IsLabelInstr())",
                         "predLastInstr->m_next->IsLabelInstr()");
      if (!bVar5) goto LAB_004186a4;
      *puVar8 = 0;
      pIVar13 = pIVar10->m_next;
      IVar4 = pIVar13->m_kind;
    }
    if ((IVar4 != InstrKindLabel) && (IVar4 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar5) goto LAB_004186a4;
      *puVar8 = 0;
    }
    pRVar9 = (Region *)pIVar13[1].m_src2;
    if (pIVar10->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar5) goto LAB_004186a4;
      *puVar8 = 0;
    }
    if (this_00 == pIVar10[1].m_next) {
      if ((pRVar9 == (Region *)0x0) || (pRVar9->type != RegionTypeTry)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x7ff,"(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry)"
                           ,"tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry");
        if (!bVar5) goto LAB_004186a4;
        *puVar8 = 0;
      }
      pRVar7 = Region::New(RegionTypeFinally,predRegion,this->func);
      pRVar7->matchingTryRegion = pRVar9;
      pRVar9->matchingFinallyOnExceptRegion = pRVar7;
      *tryInstr = pIVar10;
      return pRVar7;
    }
    func = this->func;
LAB_00418489:
    pRVar9 = Region::New(RegionTypeTry,predRegion,func);
    *tryInstr = pIVar10;
    return pRVar9;
  case Catch:
    goto switchD_00417fba_caseD_e9;
  case LeaveNull:
    if (predRegion->parent != (Region *)0x0) {
      return predRegion->parent;
    }
    bVar5 = Func::IsLoopBodyInTry(this->func);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      lineNumber = 0x82a;
LAB_00418587:
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,lineNumber,"(this->func->IsLoopBodyInTry())",
                         "this->func->IsLoopBodyInTry()");
      if (!bVar5) goto LAB_004186a4;
      *puVar8 = 0;
    }
    break;
  case Leave:
    if ((this_00->m_next != (Instr *)0x0) && (this_00->m_next->m_opcode == Finally)) {
      if (predRegion->matchingFinallyOnExceptRegion == (Region *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x810,"(tryRegion->GetMatchingFinallyRegion(true) != nullptr)",
                           "tryRegion->GetMatchingFinallyRegion(true) != nullptr");
        if (!bVar5) goto LAB_004186a4;
        *puVar8 = 0;
      }
      pRVar9 = Region::New(RegionTypeFinally,predRegion->parent,this->func);
      if (predRegion->type != RegionTypeTry) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x812,"(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry)"
                           ,"tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry");
        if (!bVar5) goto LAB_004186a4;
        *puVar8 = 0;
      }
      pRVar9->matchingTryRegion = predRegion;
      predRegion->matchingFinallyOnNoExceptRegion = pRVar9;
      return pRVar9;
    }
    if (predRegion->parent != (Region *)0x0) {
      return predRegion->parent;
    }
    bVar5 = Func::IsLoopBodyInTry(this->func);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      lineNumber = 0x81e;
      goto LAB_00418587;
    }
    break;
  default:
    if (OVar1 == BrOnException) {
      if ((predRegion->type != RegionTypeFinally) &&
         (pIVar10 = IR::Instr::GetNextRealInstr(this_00), pIVar10->m_opcode == LeaveNull)) {
        return predRegion->parent;
      }
    }
    else if (OVar1 == BailOnException) {
      if ((this_00->m_next == (Instr *)0x0) || (this_00->m_next->m_opcode != Finally)) {
        return (Region *)0x0;
      }
      pRVar9 = predRegion->matchingTryRegion;
      pRVar7 = Region::New(RegionTypeFinally,predRegion->parent,this->func);
      if ((pRVar9 == (Region *)0x0) || (pRVar9->type != RegionTypeTry)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x835,"(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry)"
                           ,"tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry");
        if (!bVar5) goto LAB_004186a4;
        *puVar8 = 0;
      }
      pRVar7->matchingTryRegion = pRVar9;
      pRVar9->matchingFinallyOnNoExceptRegion = pRVar7;
      return pRVar7;
    }
    goto switchD_00417fba_caseD_e9;
  }
  if (pIVar10->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar5) {
LAB_004186a4:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  *(byte *)&pIVar10[1]._vptr_Instr = *(byte *)&pIVar10[1]._vptr_Instr | 4;
switchD_00417fba_caseD_e9:
  return predRegion;
}

Assistant:

Region *
FlowGraph::PropagateRegionFromPred(BasicBlock * block, BasicBlock * predBlock, Region * predRegion, IR::Instr * &tryInstr)
{
    // Propagate predRegion to region, looking at the flow transition for an opcode
    // that affects the region.
    Region * region = nullptr;
    IR::Instr * predLastInstr = predBlock->GetLastInstr();
    IR::Instr * firstInstr = block->GetFirstInstr();
    if (predLastInstr == nullptr)
    {
        // Empty block: trivially propagate the region.
        region = predRegion;
    }
    else
    {
        Region * tryRegion = nullptr;
        IR::LabelInstr * tryInstrNext = nullptr;
        switch (predLastInstr->m_opcode)
        {
        case Js::OpCode::TryCatch:
            // Entry to a try-catch. See whether we're entering the try or the catch
            // by looking for the handler label.
            Assert(predLastInstr->m_next->IsLabelInstr());
            tryInstrNext = predLastInstr->m_next->AsLabelInstr();
            tryRegion = tryInstrNext->GetRegion();

            if (firstInstr == predLastInstr->AsBranchInstr()->GetTarget())
            {
                region = Region::New(RegionTypeCatch, predRegion, this->func);
                Assert(tryRegion);
                region->SetMatchingTryRegion(tryRegion);
                tryRegion->SetMatchingCatchRegion(region);
            }
            else
            {
                region = Region::New(RegionTypeTry, predRegion, this->func);
                tryInstr = predLastInstr;
            }
            break;

        case Js::OpCode::TryFinally:
            // Entry to a try-finally. See whether we're entering the try or the finally
            // by looking for the handler label.
            Assert(predLastInstr->m_next->IsLabelInstr());
            tryInstrNext = predLastInstr->m_next->AsLabelInstr();
            tryRegion = tryInstrNext->GetRegion();

            if (firstInstr == predLastInstr->AsBranchInstr()->GetTarget())
            {
                Assert(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry);
                region = Region::New(RegionTypeFinally, predRegion, this->func);
                region->SetMatchingTryRegion(tryRegion);
                tryRegion->SetMatchingFinallyRegion(region, true);
                tryInstr = predLastInstr;
            }
            else
            {
                region = Region::New(RegionTypeTry, predRegion, this->func);
                tryInstr = predLastInstr;
            }
            break;

        case Js::OpCode::Leave:
            if (firstInstr->m_next && firstInstr->m_next->m_opcode == Js::OpCode::Finally)
            {
                tryRegion = predRegion;
                Assert(tryRegion->GetMatchingFinallyRegion(true) != nullptr);
                region = Region::New(RegionTypeFinally, predRegion->GetParent(), this->func);
                Assert(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry);
                region->SetMatchingTryRegion(tryRegion);
                tryRegion->SetMatchingFinallyRegion(region, false);
                break;
            }

            // Exiting a try or handler. Retrieve the current region's parent.
            region = predRegion->GetParent();
            if (region == nullptr)
            {
                // We found a Leave in the root region- this can only happen when a jitted loop body
                // in a try block has a return statement.
                Assert(this->func->IsLoopBodyInTry());
                predLastInstr->AsBranchInstr()->m_isOrphanedLeave = true;
                region = predRegion;
            }
            break;
        case Js::OpCode::LeaveNull:
            // Exiting a try or handler. Retrieve the current region's parent.
            region = predRegion->GetParent();
            if (region == nullptr)
            {
                // We found a Leave in the root region- this can only happen when a jitted loop body
                // in a try block has a return statement.
                Assert(this->func->IsLoopBodyInTry());
                predLastInstr->AsBranchInstr()->m_isOrphanedLeave = true;
                region = predRegion;
            }
            break;
        case Js::OpCode::BailOnException:
            // Infinite loop, no edge to non excepting finally
            if (firstInstr->m_next && firstInstr->m_next->m_opcode == Js::OpCode::Finally)
            {
                tryRegion = predRegion->GetMatchingTryRegion();
                region = Region::New(RegionTypeFinally, predRegion->GetParent(), this->func);
                Assert(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry);
                region->SetMatchingTryRegion(tryRegion);
                tryRegion->SetMatchingFinallyRegion(region, false);
            }
            break;
        case Js::OpCode::BrOnException:
            // Infinite loop inside another EH region within finally,
            // We have added edges for all infinite loops inside a finally, identify that and transition to parent
            if (predRegion->GetType() != RegionTypeFinally && firstInstr->GetNextRealInstr()->m_opcode == Js::OpCode::LeaveNull)
            {
                region = predRegion->GetParent();
            }
            else
            {
                region = predRegion;
            }
            break;
        default:
            // Normal (non-EH) transition: just propagate the region.
            region = predRegion;
            break;
        }
    }
    return region;
}